

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Pgno finalDbSize(BtShared *pBt,Pgno nOrig,Pgno nFree)

{
  ulong uVar1;
  Pgno PVar2;
  Pgno PVar3;
  uint uVar4;
  Pgno pgno;
  uint uVar5;
  
  uVar1 = (ulong)pBt->usableSize / 5;
  PVar2 = ptrmapPageno(pBt,nOrig);
  uVar4 = nOrig - ((int)((PVar2 + (nFree - nOrig) + (int)uVar1) / uVar1) + nFree);
  uVar5 = (uint)sqlite3PendingByte / pBt->pageSize + 1;
  PVar2 = uVar4 - (uVar4 < uVar5 && uVar5 < nOrig);
  do {
    pgno = PVar2;
    PVar3 = ptrmapPageno(pBt,pgno);
    PVar2 = pgno - 1;
  } while (pgno == uVar5 || pgno == PVar3);
  return pgno;
}

Assistant:

static Pgno finalDbSize(BtShared *pBt, Pgno nOrig, Pgno nFree){
  int nEntry;                     /* Number of entries on one ptrmap page */
  Pgno nPtrmap;                   /* Number of PtrMap pages to be freed */
  Pgno nFin;                      /* Return value */

  nEntry = pBt->usableSize/5;
  nPtrmap = (nFree-nOrig+PTRMAP_PAGENO(pBt, nOrig)+nEntry)/nEntry;
  nFin = nOrig - nFree - nPtrmap;
  if( nOrig>PENDING_BYTE_PAGE(pBt) && nFin<PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }
  while( PTRMAP_ISPAGE(pBt, nFin) || nFin==PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }

  return nFin;
}